

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O0

void formatRect(QDebug *debug,QRect r)

{
  long lVar1;
  QDebug *this;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QDebug *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QRect::width(in_RDI);
  QDebug::operator<<(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  this = QDebug::operator<<(in_stack_ffffffffffffffc0,(char)((ulong)in_RDI >> 0x38));
  QRect::height(in_RDI);
  QDebug::operator<<(this,(int)((ulong)in_RDI >> 0x20));
  QDebug::operator<<(this,(QTextStreamFunction)in_RDI);
  QRect::x((QRect *)0x1d126a);
  QDebug::operator<<(this,(int)((ulong)in_RDI >> 0x20));
  QRect::y((QRect *)0x1d1285);
  QDebug::operator<<(this,(int)((ulong)in_RDI >> 0x20));
  QDebug::operator<<(this,(QTextStreamFunction)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void formatRect(QDebug &debug, const QRect r)
{
    debug << r.width() << 'x' << r.height()
        << Qt::forcesign << r.x() << r.y() << Qt::noforcesign;
}